

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instr.cc
# Opt level: O1

string * __thiscall
flow::Instr::formatOne(string *__return_storage_ptr__,Instr *this,string *mnemonic)

{
  size_type sVar1;
  Value *pVVar2;
  string *psVar3;
  long lVar4;
  ostream *poVar5;
  size_t sVar6;
  Signature *pSVar7;
  long lVar8;
  Constant **v;
  long *plVar9;
  long *plVar10;
  char *pcVar11;
  undefined8 uVar12;
  undefined4 *puVar13;
  undefined8 *puVar14;
  _Alloc_hider _Var15;
  undefined4 *puVar16;
  Cidr *pCVar17;
  long lVar18;
  Constant **v_3;
  long lVar19;
  bool bVar20;
  byte bVar21;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  stringstream sstr;
  string local_438;
  long *local_410;
  long *local_408;
  long local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f8;
  size_type sStack_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  string *local_3d8;
  undefined1 local_3d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3c0;
  undefined1 local_3b0 [18];
  undefined1 local_39e [486];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  bVar21 = 0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((this->super_Value).type_ == Void) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(mnemonic->_M_dataplus)._M_p,mnemonic->_M_string_length);
  }
  else {
    sVar1 = (this->super_Value).name_._M_string_length;
    if (sVar1 == 0) {
      local_3f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(mnemonic->_M_dataplus)._M_p;
      sStack_3f0 = mnemonic->_M_string_length;
      aStack_3c0._M_allocated_capacity = 0;
      local_3d0._0_8_ = &PTR_grow_00194440;
      aStack_3c0._8_8_ = 500;
      format_str_00.size_ = 9;
      format_str_00.data_ = "%??? = {}";
      args_00.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_3f8;
      args_00.types_ = 0xb;
      local_3d0._8_8_ = local_3b0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)local_3d0,format_str_00,args_00);
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_438,local_3d0._8_8_,
                 (undefined1 *)(local_3d0._8_8_ + aStack_3c0._M_allocated_capacity));
      local_3d0._0_8_ = &PTR_grow_00194440;
      if ((undefined1 *)local_3d0._8_8_ != local_3b0) {
        operator_delete((void *)local_3d0._8_8_,aStack_3c0._8_8_);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_438._M_dataplus._M_p,local_438._M_string_length);
      local_3e8._M_allocated_capacity = local_438.field_2._M_allocated_capacity;
      _Var15._M_p = local_438._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p == &local_438.field_2) goto LAB_0014b22b;
    }
    else {
      local_438._M_dataplus._M_p = (this->super_Value).name_._M_dataplus._M_p;
      local_438.field_2._M_allocated_capacity = (size_type)(mnemonic->_M_dataplus)._M_p;
      local_438.field_2._8_8_ = mnemonic->_M_string_length;
      aStack_3c0._M_allocated_capacity = 0;
      local_3d0._0_8_ = &PTR_grow_00194440;
      aStack_3c0._8_8_ = 500;
      format_str.size_ = 8;
      format_str.data_ = "%{} = {}";
      args.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_438;
      args.types_ = 0xbb;
      local_438._M_string_length = sVar1;
      local_3d0._8_8_ = local_3b0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)local_3d0,format_str,args);
      local_3f8 = &local_3e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,local_3d0._8_8_,
                 (undefined1 *)(local_3d0._8_8_ + aStack_3c0._M_allocated_capacity));
      local_3d0._0_8_ = &PTR_grow_00194440;
      if ((undefined1 *)local_3d0._8_8_ != local_3b0) {
        operator_delete((void *)local_3d0._8_8_,aStack_3c0._8_8_);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_3f8->_M_local_buf,sStack_3f0);
      _Var15._M_p = (pointer)local_3f8;
      if (local_3f8 == &local_3e8) goto LAB_0014b22b;
    }
    operator_delete(_Var15._M_p,(ulong)(local_3e8._M_allocated_capacity + 1));
  }
LAB_0014b22b:
  lVar19 = (long)(this->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_3d8 = __return_storage_ptr__;
  if (lVar19 != 0) {
    lVar19 = lVar19 >> 3;
    lVar18 = 0;
    local_400 = lVar19;
    do {
      pcVar11 = ", ";
      if (lVar18 == 0) {
        pcVar11 = " ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar11,(ulong)(lVar18 != 0) + 1)
      ;
      pVVar2 = (this->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar18];
      if ((pVVar2 == (Value *)0x0) ||
         (lVar4 = __dynamic_cast(pVVar2,&Value::typeinfo,&Constant::typeinfo,0), lVar4 == 0)) {
LAB_0014b6ce:
        local_3d0[0] = 0x25;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3d0,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(pVVar2->name_)._M_dataplus._M_p,(pVVar2->name_)._M_string_length);
      }
      else {
        lVar4 = __dynamic_cast(pVVar2,&Value::typeinfo,
                               &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
        if (lVar4 == 0) {
          lVar4 = __dynamic_cast(pVVar2,&Value::typeinfo,
                                 &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo
                                 ,0);
          if (lVar4 == 0) {
            lVar4 = __dynamic_cast(pVVar2,&Value::typeinfo,
                                   &ConstantValue<flow::util::IPAddress,(flow::LiteralType)5>::
                                    typeinfo,0);
            if (lVar4 == 0) {
              lVar4 = __dynamic_cast(pVVar2,&Value::typeinfo,
                                     &ConstantValue<flow::util::Cidr,(flow::LiteralType)6>::typeinfo
                                     ,0);
              if (lVar4 == 0) {
                lVar4 = __dynamic_cast(pVVar2,&Value::typeinfo,
                                       &ConstantValue<flow::util::RegExp,(flow::LiteralType)7>::
                                        typeinfo,0);
                if (lVar4 == 0) {
                  lVar4 = __dynamic_cast(pVVar2,&Value::typeinfo,&IRBuiltinHandler::typeinfo,0);
                  if (lVar4 == 0) {
                    lVar4 = __dynamic_cast(pVVar2,&Value::typeinfo,&IRBuiltinFunction::typeinfo,0);
                    if (lVar4 == 0) {
                      lVar4 = __dynamic_cast(pVVar2,&Value::typeinfo,&ConstantArray::typeinfo,0);
                      if (lVar4 == 0) goto LAB_0014b6ce;
                      local_3d0[0] = 0x5b;
                      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3d0,1);
                      switch(*(undefined4 *)(lVar4 + 8)) {
                      case 9:
                        plVar9 = *(long **)(lVar4 + 0x48);
                        local_410 = *(long **)(lVar4 + 0x50);
                        if (plVar9 != local_410) {
                          lVar4 = 0;
                          do {
                            bVar20 = lVar4 != 0;
                            lVar4 = lVar4 + -1;
                            if (bVar20) {
                              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
                            }
                            std::ostream::_M_insert<long>((long)local_1a8);
                            plVar9 = plVar9 + 1;
                          } while (plVar9 != local_410);
                        }
                        break;
                      case 10:
                        plVar9 = *(long **)(lVar4 + 0x48);
                        local_408 = *(long **)(lVar4 + 0x50);
                        if (plVar9 != local_408) {
                          plVar10 = (long *)0x0;
                          do {
                            local_410 = (long *)((long)plVar10 + -1);
                            if (plVar10 != (long *)0x0) {
                              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
                            }
                            local_3d0[0] = 0x22;
                            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                               (local_1a8,local_3d0,1);
                            local_3d0._0_8_ = &aStack_3c0;
                            lVar4 = *(long *)(*plVar9 + 0x48);
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)local_3d0,lVar4,*(long *)(*plVar9 + 0x50) + lVar4);
                            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                               (poVar5,(char *)local_3d0._0_8_,local_3d0._8_8_);
                            local_438._M_dataplus._M_p._0_1_ = 0x22;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar5,(char *)&local_438,1);
                            plVar10 = local_410;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3d0._0_8_ != &aStack_3c0) {
                              operator_delete((void *)local_3d0._0_8_,
                                              (ulong)(aStack_3c0._M_allocated_capacity + 1));
                            }
                            plVar9 = plVar9 + 1;
                          } while (plVar9 != local_408);
                        }
                        break;
                      case 0xb:
                        plVar9 = *(long **)(lVar4 + 0x48);
                        local_408 = *(long **)(lVar4 + 0x50);
                        if (plVar9 != local_408) {
                          plVar10 = (long *)0x0;
                          do {
                            if (plVar10 != (long *)0x0) {
                              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
                            }
                            puVar13 = (undefined4 *)(*plVar9 + 0x48);
                            puVar16 = (undefined4 *)local_3d0;
                            for (lVar4 = 0x11; lVar4 != 0; lVar4 = lVar4 + -1) {
                              *puVar16 = *puVar13;
                              puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
                              puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
                            }
                            local_410 = (long *)((long)plVar10 + -1);
                            if (local_3d0[4] == '\0') {
                              inet_ntop(local_3d0._0_4_,local_39e,local_3d0 + 4,0x2e);
                            }
                            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
                            pcVar11 = local_3d0 + 4;
                            sVar6 = strlen(pcVar11);
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_438,pcVar11,pcVar11 + sVar6);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,local_438._M_dataplus._M_p,
                                       local_438._M_string_length);
                            plVar10 = local_410;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
                              operator_delete(local_438._M_dataplus._M_p,
                                              (ulong)(local_438.field_2._M_allocated_capacity + 1));
                            }
                            plVar9 = plVar9 + 1;
                          } while (plVar9 != local_408);
                        }
                        break;
                      case 0xc:
                        plVar9 = *(long **)(lVar4 + 0x48);
                        local_410 = *(long **)(lVar4 + 0x50);
                        if (plVar9 != local_410) {
                          lVar4 = 0;
                          do {
                            bVar20 = lVar4 != 0;
                            lVar4 = lVar4 + -1;
                            if (bVar20) {
                              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
                            }
                            puVar14 = (undefined8 *)(*plVar9 + 0x48);
                            pCVar17 = (Cidr *)local_3d0;
                            for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
                              uVar12 = *puVar14;
                              (pCVar17->ipaddr_).family_ = (int)uVar12;
                              (pCVar17->ipaddr_).cstr_[0] = (char)((ulong)uVar12 >> 0x20);
                              (pCVar17->ipaddr_).cstr_[1] = (char)((ulong)uVar12 >> 0x28);
                              (pCVar17->ipaddr_).cstr_[2] = (char)((ulong)uVar12 >> 0x30);
                              (pCVar17->ipaddr_).cstr_[3] = (char)((ulong)uVar12 >> 0x38);
                              puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
                              pCVar17 = (Cidr *)((long)pCVar17 + (ulong)bVar21 * -0x10 + 8);
                            }
                            util::Cidr::str_abi_cxx11_(&local_438,(Cidr *)local_3d0);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,local_438._M_dataplus._M_p,
                                       local_438._M_string_length);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
                              operator_delete(local_438._M_dataplus._M_p,
                                              (ulong)(local_438.field_2._M_allocated_capacity + 1));
                            }
                            plVar9 = plVar9 + 1;
                          } while (plVar9 != local_410);
                        }
                        break;
                      default:
                        abort();
                      }
                      local_3d0[0] = 0x5d;
                      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3d0,1);
                    }
                    else {
                      pSVar7 = NativeCallback::signature(*(NativeCallback **)(lVar4 + 0x48));
                      Signature::to_s_abi_cxx11_((string *)local_3d0,pSVar7);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,(char *)local_3d0._0_8_,local_3d0._8_8_);
                      uVar12 = aStack_3c0._M_allocated_capacity;
                      _Var15._M_p = (pointer)local_3d0._0_8_;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3d0._0_8_ != &aStack_3c0) goto LAB_0014b49a;
                    }
                  }
                  else {
                    pSVar7 = NativeCallback::signature(*(NativeCallback **)(lVar4 + 0x48));
                    Signature::to_s_abi_cxx11_((string *)local_3d0,pSVar7);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)local_3d0._0_8_,local_3d0._8_8_);
                    uVar12 = aStack_3c0._M_allocated_capacity;
                    _Var15._M_p = (pointer)local_3d0._0_8_;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3d0._0_8_ != &aStack_3c0) {
LAB_0014b49a:
                      operator_delete(_Var15._M_p,(ulong)(uVar12 + 1));
                    }
                  }
                }
                else {
                  local_3d0[0] = 0x2f;
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     (local_1a8,(char *)local_3d0,1);
                  util::RegExp::RegExp((RegExp *)local_3d0,(RegExp *)(lVar4 + 0x48));
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar5,(char *)local_3d0._0_8_,local_3d0._8_8_);
                  local_438._M_dataplus._M_p._0_1_ = 0x2f;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_438,1);
                  util::RegExp::~RegExp((RegExp *)local_3d0);
                  lVar19 = local_400;
                }
              }
              else {
                puVar14 = (undefined8 *)(lVar4 + 0x48);
                pCVar17 = (Cidr *)local_3d0;
                for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
                  uVar12 = *puVar14;
                  (pCVar17->ipaddr_).family_ = (int)uVar12;
                  (pCVar17->ipaddr_).cstr_[0] = (char)((ulong)uVar12 >> 0x20);
                  (pCVar17->ipaddr_).cstr_[1] = (char)((ulong)uVar12 >> 0x28);
                  (pCVar17->ipaddr_).cstr_[2] = (char)((ulong)uVar12 >> 0x30);
                  (pCVar17->ipaddr_).cstr_[3] = (char)((ulong)uVar12 >> 0x38);
                  puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
                  pCVar17 = (Cidr *)((long)pCVar17 + (ulong)bVar21 * -0x10 + 8);
                }
                util::Cidr::str_abi_cxx11_(&local_438,(Cidr *)local_3d0);
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_1a8,local_438._M_dataplus._M_p,local_438._M_string_length);
                uVar12 = local_438.field_2._M_allocated_capacity;
                _Var15._M_p = local_438._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_438._M_dataplus._M_p != &local_438.field_2) goto LAB_0014b49a;
              }
            }
            else {
              puVar13 = (undefined4 *)(lVar4 + 0x48);
              puVar16 = (undefined4 *)local_3d0;
              for (lVar8 = 0x11; lVar8 != 0; lVar8 = lVar8 + -1) {
                *puVar16 = *puVar13;
                puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
                puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
              }
              if (local_3d0[4] == '\0') {
                inet_ntop(local_3d0._0_4_,local_39e,local_3d0 + 4,0x2e);
              }
              sVar6 = strlen(local_3d0 + 4);
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3d0 + 4,sVar6);
            }
          }
          else {
            local_3d0[0] = 0x22;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,(char *)local_3d0,1);
            local_3d0._0_8_ = &aStack_3c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3d0,*(long *)(lVar4 + 0x48),
                       *(long *)(lVar4 + 0x50) + *(long *)(lVar4 + 0x48));
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(char *)local_3d0._0_8_,local_3d0._8_8_);
            local_438._M_dataplus._M_p._0_1_ = 0x22;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_438,1);
            lVar19 = local_400;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0._0_8_ != &aStack_3c0) {
              operator_delete((void *)local_3d0._0_8_,(ulong)(aStack_3c0._M_allocated_capacity + 1))
              ;
              lVar19 = local_400;
            }
          }
        }
        else {
          std::ostream::_M_insert<long>((long)local_1a8);
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar19);
  }
  psVar3 = local_3d8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string Instr::formatOne(std::string mnemonic) const {
  std::stringstream sstr;

  if (type() == LiteralType::Void)
    sstr << mnemonic;
  else if (name().empty())
    sstr << fmt::format("%??? = {}", mnemonic);
  else
    sstr << fmt::format("%{} = {}", name(), mnemonic);

  for (size_t i = 0, e = operands_.size(); i != e; ++i) {
    sstr << (i ? ", " : " ");
    Value* arg = operands_[i];
    if (dynamic_cast<Constant*>(arg)) {
      if (auto i = dynamic_cast<ConstantInt*>(arg)) {
        sstr << i->get();
        continue;
      }
      if (auto s = dynamic_cast<ConstantString*>(arg)) {
        sstr << '"' << s->get() << '"';
        continue;
      }
      if (auto ip = dynamic_cast<ConstantIP*>(arg)) {
        sstr << ip->get().c_str();
        continue;
      }
      if (auto cidr = dynamic_cast<ConstantCidr*>(arg)) {
        sstr << cidr->get().str();
        continue;
      }
      if (auto re = dynamic_cast<ConstantRegExp*>(arg)) {
        sstr << '/' << re->get().pattern() << '/';
        continue;
      }
      if (auto bh = dynamic_cast<IRBuiltinHandler*>(arg)) {
        sstr << bh->signature().to_s();
        continue;
      }
      if (auto bf = dynamic_cast<IRBuiltinFunction*>(arg)) {
        sstr << bf->signature().to_s();
        continue;
      }
      if (auto ar = dynamic_cast<ConstantArray*>(arg)) {
        sstr << '[';
        size_t i = 0;
        switch (ar->type()) {
          case LiteralType::IntArray:
            for (const auto& v : ar->get()) {
              if (i) sstr << ", ";
              sstr << static_cast<ConstantInt*>(v)->get();
              ++i;
            }
            break;
          case LiteralType::StringArray:
            for (const auto& v : ar->get()) {
              if (i) sstr << ", ";
              sstr << '"' << static_cast<ConstantString*>(v)->get() << '"';
              ++i;
            }
            break;
          case LiteralType::IPAddrArray:
            for (const auto& v : ar->get()) {
              if (i) sstr << ", ";
              sstr << static_cast<ConstantIP*>(v)->get().str();
              ++i;
            }
            break;
          case LiteralType::CidrArray:
            for (const auto& v : ar->get()) {
              if (i) sstr << ", ";
              sstr << static_cast<ConstantCidr*>(v)->get().str();
              ++i;
            }
            break;
          default:
            abort();
        }
        sstr << ']';
        continue;
      }
    }
    sstr << '%' << arg->name();
  }

  // XXX sometimes u're interested in the name of the instr, even though it
  // doesn't yield a result value on the stack
  // if (type() == LiteralType::Void) {
  //   sstr << "\t; (%" << name() << ")";
  // }

  return sstr.str();
}